

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_generate_with_overlaps
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  FT_Memory memory_00;
  SDF_Contour_ *pSVar4;
  uchar *puVar5;
  SDF_Params internal_params_00;
  FT_Bool FVar6;
  byte bVar7;
  byte bVar8;
  FT_SDFFormat FVar9;
  SDF_Contour_Orientation SVar10;
  int iVar11;
  FT_Error FVar12;
  FT_Pointer P;
  FT_Pointer pvVar13;
  byte local_c2;
  byte local_c1;
  int local_c0;
  FT_SDFFormat temp;
  FT_SDFFormat val_ac;
  FT_SDFFormat val_c;
  FT_Int c;
  FT_Int id;
  void *local_a8;
  SDF_Contour_Orientation *orientations;
  FT_Bool flip_sign;
  FT_SDFFormat *t;
  FT_Memory memory;
  SDF_Shape temp_shape;
  SDF_Contour *head;
  SDF_Contour *temp_contour;
  SDF_Contour *contour;
  FT_Bitmap *bitmaps;
  FT_Int rows;
  FT_Int width;
  FT_Int j;
  FT_Int i;
  FT_Int num_contours;
  FT_Error error;
  FT_Bitmap *bitmap_local;
  SDF_Shape *pSStack_30;
  FT_UInt spread_local;
  SDF_Shape *shape_local;
  FT_Orientation local_20;
  undefined1 local_18 [5];
  undefined3 uStack_13;
  SDF_Params internal_params_local;
  
  local_20 = internal_params.overload_sign;
  shape_local = internal_params._0_8_;
  i = 0;
  local_a8 = (void *)0x0;
  temp_shape.contours = (SDF_Contour *)0x0;
  if (((shape == (SDF_Shape *)0x0) || (bitmap == (FT_Bitmap *)0x0)) ||
     (shape->memory == (FT_Memory)0x0)) {
    internal_params_local.flip_sign = '\x06';
    internal_params_local.flip_y = '\0';
    internal_params_local._6_2_ = 0;
  }
  else {
    local_18[4] = internal_params.flip_sign;
    FVar6 = local_18[4];
    uStack_13 = internal_params._5_3_;
    local_18._0_4_ = internal_params.orientation;
    local_18 = (undefined1  [5])CONCAT14(0,local_18._0_4_);
    temp_contour = shape->contours;
    memory_00 = shape->memory;
    uVar2 = bitmap->width;
    uVar3 = bitmap->rows;
    j = 0;
    for (; temp_contour != (SDF_Contour *)0x0; temp_contour = temp_contour->next) {
      j = j + 1;
    }
    memory = memory_00;
    _num_contours = bitmap;
    bitmap_local._4_4_ = spread;
    pSStack_30 = shape;
    internal_params_local.orientation = local_20;
    P = ft_mem_alloc(memory_00,(ulong)(uint)j * 0x28,&i);
    if ((i == 0) && (local_a8 = ft_mem_alloc(memory_00,(ulong)(uint)j << 2,&i), i == 0)) {
      temp_contour = pSStack_30->contours;
      for (width = 0; width < j; width = width + 1) {
        FT_Bitmap_Init((FT_Bitmap *)((long)P + (long)width * 0x28));
        *(uint *)((long)P + (long)width * 0x28 + 4) = _num_contours->width;
        *(uint *)((long)P + (long)width * 0x28) = _num_contours->rows;
        *(int *)((long)P + (long)width * 0x28 + 8) = _num_contours->pitch;
        *(unsigned_short *)((long)P + (long)width * 0x28 + 0x18) = _num_contours->num_grays;
        *(uchar *)((long)P + (long)width * 0x28 + 0x1a) = _num_contours->pixel_mode;
        pvVar13 = ft_mem_alloc(memory_00,(ulong)(_num_contours->rows * _num_contours->pitch),&i);
        *(FT_Pointer *)((long)P + (long)width * 0x28 + 0x10) = pvVar13;
        if (i != 0) goto LAB_00322d33;
        SVar10 = get_contour_orientation(temp_contour);
        *(SDF_Contour_Orientation *)((long)local_a8 + (long)width * 4) = SVar10;
        if ((*(int *)((long)local_a8 + (long)width * 4) == 2) && (local_18._0_4_ == 0)) {
          internal_params_local.orientation = FT_ORIENTATION_FILL_LEFT;
        }
        else if ((*(int *)((long)local_a8 + (long)width * 4) == 1) && (local_18._0_4_ == 1)) {
          internal_params_local.orientation = FT_ORIENTATION_FILL_LEFT;
        }
        else {
          internal_params_local.orientation = FT_ORIENTATION_FILL_RIGHT;
        }
        pSVar4 = temp_contour->next;
        temp_contour->next = (SDF_Contour_ *)0x0;
        temp_shape.memory = (FT_Memory)temp_contour;
        internal_params_00.overload_sign = internal_params_local.orientation;
        internal_params_00.orientation = local_18._0_4_;
        internal_params_00.flip_sign = local_18[4];
        internal_params_00.flip_y = (undefined1)uStack_13;
        internal_params_00._6_2_ = uStack_13._1_2_;
        i = sdf_generate_subdivision
                      (internal_params_00,(SDF_Shape *)&memory,bitmap_local._4_4_,
                       (FT_Bitmap *)((long)P + (long)width * 0x28));
        if (i != 0) goto LAB_00322d33;
        temp_contour->next = pSVar4;
        (temp_shape.memory)->realloc = (FT_Realloc_Func)temp_shape.contours;
        temp_shape.contours = (SDF_Contour *)temp_shape.memory;
        if (local_18._0_4_ == 1) {
          if (*(int *)((long)local_a8 + (long)width * 4) == 1) {
            *(undefined4 *)((long)local_a8 + (long)width * 4) = 2;
          }
          else if (*(int *)((long)local_a8 + (long)width * 4) == 2) {
            *(undefined4 *)((long)local_a8 + (long)width * 4) = 1;
          }
        }
        temp_contour = temp_contour->next;
      }
      pSStack_30->contours = temp_shape.contours;
      puVar5 = _num_contours->buffer;
      for (rows = 0; rows < (int)uVar3; rows = rows + 1) {
        for (width = 0; width < (int)uVar2; width = width + 1) {
          iVar11 = rows * uVar2 + width;
          local_c1 = 0;
          local_c2 = 0xff;
          for (local_c0 = 0; local_c0 < j; local_c0 = local_c0 + 1) {
            bVar1 = *(byte *)(*(long *)((long)P + (long)local_c0 * 0x28 + 0x10) + (long)iVar11);
            bVar7 = local_c2;
            bVar8 = local_c1;
            if (*(int *)((long)local_a8 + (long)local_c0 * 4) == 1) {
              bVar8 = bVar1;
              if (bVar1 < local_c1) {
                bVar8 = local_c1;
              }
            }
            else {
              bVar7 = bVar1;
              if (local_c2 < bVar1) {
                bVar7 = local_c2;
              }
            }
            local_c1 = bVar8;
            local_c2 = bVar7;
          }
          if (local_c1 < local_c2) {
            local_c2 = local_c1;
          }
          puVar5[iVar11] = local_c2;
          if (FVar6 != '\0') {
            FVar9 = invert_sign(puVar5[iVar11]);
            puVar5[iVar11] = FVar9;
          }
        }
      }
    }
LAB_00322d33:
    if (local_a8 != (void *)0x0) {
      ft_mem_free(memory_00,local_a8);
    }
    if (P != (FT_Pointer)0x0) {
      if (j == 0) {
        i = 0x61;
      }
      else {
        for (width = 0; width < j; width = width + 1) {
          ft_mem_free(memory_00,*(void **)((long)P + (long)width * 0x28 + 0x10));
          *(undefined8 *)((long)P + (long)width * 0x28 + 0x10) = 0;
        }
        ft_mem_free(memory_00,P);
      }
    }
    internal_params_local.flip_sign = (undefined1)i;
    internal_params_local.flip_y = i._1_1_;
    internal_params_local._6_2_ = i._2_2_;
  }
  FVar12._0_1_ = internal_params_local.flip_sign;
  FVar12._1_1_ = internal_params_local.flip_y;
  FVar12._2_2_ = internal_params_local._6_2_;
  return FVar12;
}

Assistant:

static FT_Error
  sdf_generate_with_overlaps( SDF_Params        internal_params,
                              SDF_Shape*        shape,
                              FT_UInt           spread,
                              const FT_Bitmap*  bitmap )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Int      num_contours;        /* total number of contours      */
    FT_Int      i, j;                /* iterators                     */
    FT_Int      width, rows;         /* width and rows of the bitmap  */
    FT_Bitmap*  bitmaps;             /* separate bitmaps for contours */

    SDF_Contour*  contour;           /* temporary variable to iterate */
    SDF_Contour*  temp_contour;      /* temporary contour             */
    SDF_Contour*  head;              /* head of the contour list      */
    SDF_Shape     temp_shape;        /* temporary shape               */

    FT_Memory      memory;           /* to allocate memory            */
    FT_SDFFormat*  t;                /* target bitmap buffer          */
    FT_Bool        flip_sign;        /* flip sign?                    */

    /* orientation of all the separate contours */
    SDF_Contour_Orientation*  orientations;


    bitmaps      = NULL;
    orientations = NULL;
    head         = NULL;

    if ( !shape || !bitmap || !shape->memory )
      return FT_THROW( Invalid_Argument );

    /* Disable `flip_sign` to avoid extra complication */
    /* during the combination phase.                   */
    flip_sign                 = internal_params.flip_sign;
    internal_params.flip_sign = 0;

    contour           = shape->contours;
    memory            = shape->memory;
    temp_shape.memory = memory;
    width             = (FT_Int)bitmap->width;
    rows              = (FT_Int)bitmap->rows;
    num_contours      = 0;

    /* find the number of contours in the shape */
    while ( contour )
    {
      num_contours++;
      contour = contour->next;
    }

    /* allocate the bitmaps to generate SDF for separate contours */
    if ( FT_ALLOC( bitmaps,
                   (FT_UInt)num_contours * sizeof ( *bitmaps ) ) )
      goto Exit;

    /* allocate array to hold orientation for all contours */
    if ( FT_ALLOC( orientations,
                   (FT_UInt)num_contours * sizeof ( *orientations ) ) )
      goto Exit;

    contour = shape->contours;

    /* Iterate over all contours and generate SDF separately. */
    for ( i = 0; i < num_contours; i++ )
    {
      /* initialize the corresponding bitmap */
      FT_Bitmap_Init( &bitmaps[i] );

      bitmaps[i].width      = bitmap->width;
      bitmaps[i].rows       = bitmap->rows;
      bitmaps[i].pitch      = bitmap->pitch;
      bitmaps[i].num_grays  = bitmap->num_grays;
      bitmaps[i].pixel_mode = bitmap->pixel_mode;

      /* allocate memory for the buffer */
      if ( FT_ALLOC( bitmaps[i].buffer,
                     bitmap->rows * (FT_UInt)bitmap->pitch ) )
        goto Exit;

      /* determine the orientation */
      orientations[i] = get_contour_orientation( contour );

      /* The `overload_sign` property is specific to  */
      /* `sdf_generate_bounding_box`.  This basically */
      /* overloads the default sign of the outside    */
      /* pixels, which is necessary for               */
      /* counter-clockwise contours.                  */
      if ( orientations[i] == SDF_ORIENTATION_CCW                   &&
           internal_params.orientation == FT_ORIENTATION_FILL_RIGHT )
        internal_params.overload_sign = 1;
      else if ( orientations[i] == SDF_ORIENTATION_CW                   &&
                internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
        internal_params.overload_sign = 1;
      else
        internal_params.overload_sign = 0;

      /* Make `contour->next` NULL so that there is   */
      /* one contour in the list.  Also hold the next */
      /* contour in a temporary variable so as to     */
      /* restore the original value.                  */
      temp_contour  = contour->next;
      contour->next = NULL;

      /* Use `temp_shape` to hold the new contour. */
      /* Now, `temp_shape` has only one contour.   */
      temp_shape.contours = contour;

      /* finally generate the SDF */
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         &temp_shape,
                                         spread,
                                         &bitmaps[i] ) );

      /* Restore the original `next` variable. */
      contour->next = temp_contour;

      /* Since `split_sdf_shape` deallocated the original */
      /* contours list we need to assign the new value to */
      /* the shape's contour.                             */
      temp_shape.contours->next = head;
      head                      = temp_shape.contours;

      /* Simply flip the orientation in case of post-script fonts */
      /* so as to avoid modificatons in the combining phase.      */
      if ( internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
      {
        if ( orientations[i] == SDF_ORIENTATION_CW )
          orientations[i] = SDF_ORIENTATION_CCW;
        else if ( orientations[i] == SDF_ORIENTATION_CCW )
          orientations[i] = SDF_ORIENTATION_CW;
      }

      contour = contour->next;
    }

    /* assign the new contour list to `shape->contours` */
    shape->contours = head;

    /* cast the output bitmap buffer */
    t = (FT_SDFFormat*)bitmap->buffer;

    /* Iterate over all pixels and combine all separate    */
    /* contours.  These are the rules for combining:       */
    /*                                                     */
    /* (1) For all clockwise contours, compute the largest */
    /*     value.  Name this as `val_c`.                   */
    /* (2) For all counter-clockwise contours, compute the */
    /*     smallest value.  Name this as `val_ac`.         */
    /* (3) Now, finally use the smaller value of `val_c'   */
    /*     and `val_ac'.                                   */
    for ( j = 0; j < rows; j++ )
    {
      for ( i = 0; i < width; i++ )
      {
        FT_Int  id = j * width + i;       /* index of current pixel    */
        FT_Int  c;                        /* contour iterator          */

        FT_SDFFormat  val_c  = 0;         /* max clockwise value       */
        FT_SDFFormat  val_ac = UCHAR_MAX; /* min counter-clockwise val */


        /* iterate through all the contours */
        for ( c = 0; c < num_contours; c++ )
        {
          /* current contour value */
          FT_SDFFormat  temp = ( (FT_SDFFormat*)bitmaps[c].buffer )[id];


          if ( orientations[c] == SDF_ORIENTATION_CW )
            val_c = FT_MAX( val_c, temp );   /* clockwise         */
          else
            val_ac = FT_MIN( val_ac, temp ); /* counter-clockwise */
        }

        /* Finally find the smaller of the two and assign to output. */
        /* Also apply `flip_sign` if set.                            */
        t[id] = FT_MIN( val_c, val_ac );

        if ( flip_sign )
          t[id] = invert_sign( t[id] );
      }
    }

  Exit:
    /* deallocate orientations array */
    if ( orientations )
      FT_FREE( orientations );

    /* deallocate temporary bitmaps */
    if ( bitmaps )
    {
      if ( num_contours == 0 )
        error = FT_THROW( Raster_Corrupted );
      else
      {
        for ( i = 0; i < num_contours; i++ )
          FT_FREE( bitmaps[i].buffer );

        FT_FREE( bitmaps );
      }
    }

    /* restore the `flip_sign` property */
    internal_params.flip_sign = flip_sign;

    return error;
  }